

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O2

uint32_t PatchTitleScreen::inject_pointer_func(ROM *rom,uint32_t pointed_addr)

{
  uint32_t uVar1;
  Code pointer_func;
  allocator<char> local_a9;
  string local_a8;
  Code local_88;
  
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_string_length._0_1_ = 0;
  local_a8._M_dataplus._M_p = (pointer)&PTR_getXn_00246c60;
  local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea(&local_88,pointed_addr,(AddressRegister *)&local_a8);
  local_a8._M_string_length._0_1_ = 1;
  local_a8._M_dataplus._M_p = (pointer)&PTR_getXn_00246c60;
  md::Code::lea(&local_88,0xff2c00,(AddressRegister *)&local_a8);
  md::Code::rts(&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  uVar1 = md::ROM::inject_code(rom,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  md::Code::~Code(&local_88);
  return uVar1;
}

Assistant:

static uint32_t inject_pointer_func(md::ROM& rom, uint32_t pointed_addr)
    {
        md::Code pointer_func;
        {
            pointer_func.lea(pointed_addr, reg_A0);
            pointer_func.lea(0x00FF2C00, reg_A1);
        }
        pointer_func.rts();

        return rom.inject_code(pointer_func);
    }